

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macros.cc
# Opt level: O0

bool __thiscall pstack::Dwarf::Macros::visit4(Macros *this,Unit *u,MacroVisitor *visitor)

{
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  unsigned_long end_;
  uintmax_t uVar4;
  uintmax_t __n;
  pointer pLVar5;
  reference pvVar6;
  reference pvVar7;
  value_type *fileinfo;
  uintmax_t file;
  uintmax_t line_2;
  string text_1;
  uintmax_t line_1;
  string text;
  uintmax_t line;
  DWARF_MACINFO_CODE code;
  bool done;
  shared_ptr<const_pstack::Reader> local_68;
  undefined1 local_58 [8];
  DWARFReader dr;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *lineinfo;
  MacroVisitor *visitor_local;
  Unit *u_local;
  Macros *this_local;
  
  dr._32_8_ = Unit::getLines(u);
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&local_68,&this->io);
  end_ = std::numeric_limits<unsigned_long>::max();
  DWARFReader::DWARFReader((DWARFReader *)local_58,&local_68,0,end_);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_68);
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (bVar1) {
              this_local._7_1_ = true;
              goto LAB_002407d7;
            }
            uVar2 = DWARFReader::getu8((DWARFReader *)local_58);
            if (uVar2 != '\0') break;
            bVar1 = true;
          }
          if (uVar2 != '\x01') break;
          text.field_2._8_8_ = DWARFReader::getuleb128((DWARFReader *)local_58);
          DWARFReader::getstring_abi_cxx11_((string *)&line_1,(DWARFReader *)local_58);
          (*(code *)**(undefined8 **)visitor)(visitor,text.field_2._8_8_ & 0xffffffff,&line_1);
          std::__cxx11::string::~string((string *)&line_1);
        }
        if (uVar2 != '\x02') break;
        text_1.field_2._8_8_ = DWARFReader::getuleb128((DWARFReader *)local_58);
        DWARFReader::getstring_abi_cxx11_((string *)&line_2,(DWARFReader *)local_58);
        (**(code **)(*(long *)visitor + 8))(visitor,text_1.field_2._8_8_ & 0xffffffff,&line_2);
        std::__cxx11::string::~string((string *)&line_2);
      }
      if (uVar2 != '\x03') break;
      uVar4 = DWARFReader::getuleb128((DWARFReader *)local_58);
      __n = DWARFReader::getuleb128((DWARFReader *)local_58);
      pLVar5 = std::
               unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
               operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                           *)dr._32_8_);
      pvVar6 = std::vector<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>::
               operator[](&pLVar5->files,__n);
      pLVar5 = std::
               unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>::
               operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                           *)dr._32_8_);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&pLVar5->directories,(ulong)pvVar6->dirindex);
      bVar3 = (**(code **)(*(long *)visitor + 0x10))(visitor,uVar4 & 0xffffffff,pvVar7,pvVar6);
      if ((bVar3 & 1) == 0) {
        this_local._7_1_ = false;
        goto LAB_002407d7;
      }
    }
  } while ((uVar2 != '\x04') || (bVar3 = (**(code **)(*(long *)visitor + 0x18))(), (bVar3 & 1) != 0)
          );
  this_local._7_1_ = false;
LAB_002407d7:
  DWARFReader::~DWARFReader((DWARFReader *)local_58);
  return this_local._7_1_;
}

Assistant:

bool
Macros::visit4(Unit &u, MacroVisitor *visitor) const
{
    const auto &lineinfo = u.getLines();
    DWARFReader dr(io);
    for (bool done = false; !done; ) {
        auto code = DWARF_MACINFO_CODE(dr.getu8());
        switch (code) {
            case DW_MACINFO_define: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->define(line, text);
                break;
            }
            case DW_MACINFO_eol: {
                done = true;
                break;
            }
            case DW_MACINFO_undef: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->undef(line, text);
                break;
            }
            case DW_MACINFO_start_file: {
                auto line = dr.getuleb128();
                auto file = dr.getuleb128();
                auto &fileinfo = lineinfo->files[file];
                if (!visitor->startFile(line, lineinfo->directories[fileinfo.dirindex], fileinfo))
                    return false;
                break;
            }
            case DW_MACINFO_end_file: {
                if (!visitor->endFile())
                    return 0;
                break;
            }
            case DW_MACINFO_vendor_ext:
                break;
        }
    }
    return true;
}